

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

void __thiscall
axl::sl::ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::attach
          (ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *this,Hdr *hdr,
          unsigned_long *p,size_t count)

{
  RefCount *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  
  if (in_RSI != in_RDI[1]) {
    if (in_RSI != 0) {
      rc::RefCount::addRef((RefCount *)0x10d4ae);
    }
    if (in_RDI[1] != 0) {
      rc::RefCount::release(in_RCX);
    }
    in_RDI[1] = in_RSI;
  }
  *in_RDI = in_RDX;
  in_RDI[2] = in_RCX;
  return;
}

Assistant:

void
	attach(
		Hdr* hdr,
		T* p,
		size_t count
	) {
		if (hdr != m_hdr) { // try to avoid unnecessary interlocked ops
			if (hdr)
				hdr->addRef();

			if (m_hdr)
				m_hdr->release();

			m_hdr = hdr;
		}

		m_p = p;
		m_count = count;
	}